

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Random_keys.cpp
# Opt level: O3

int __thiscall
Random_keys::avancaGeracaoesAdaptativo2
          (Random_keys *this,Graph *g,int it_s_melhora,float maxMutacao,float max_pct,
          float taxaTamMut,float taxaPctMut)

{
  pointer ppRVar1;
  RK_Individual *pRVar2;
  double dVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  Random_keys *this_00;
  uint uVar13;
  ulong uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  float fVar17;
  float fVar18;
  vector<int,_std::allocator<int>_> chamadaGeracao;
  int local_c0;
  int local_bc;
  int *local_b8;
  iterator iStack_b0;
  int *local_a8;
  double local_a0;
  float local_98;
  float local_94;
  float local_90;
  float local_8c;
  int local_88;
  int local_84;
  ulong local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  Graph *local_50;
  vector<RK_Individual_*,_std::allocator<RK_Individual_*>_> *local_48;
  vector<RK_Individual_*,_std::allocator<RK_Individual_*>_> *local_40;
  double local_38;
  
  local_b8 = (int *)0x0;
  iStack_b0._M_current = (int *)0x0;
  local_a8 = (int *)0x0;
  ppRVar1 = (this->popAtual).super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_98 = maxMutacao;
  local_94 = max_pct;
  local_90 = taxaTamMut;
  local_8c = taxaPctMut;
  local_88 = it_s_melhora;
  if ((ulong)((long)(this->popAtual).
                    super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)ppRVar1 >> 3) <=
      (long)this->tamPop - 1U) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  }
  pRVar2 = ppRVar1[(long)this->tamPop + -1];
  ordenaPopulacaoAtual(this,g);
  local_bc = 0;
  if (this->numGeracoes < 1) {
    iVar4 = 0;
  }
  else {
    local_a0 = pRVar2->active_loss * 100000.0;
    local_40 = &this->popAtual;
    local_48 = &this->popAnterior;
    local_68 = 0x3dcccccd;
    uStack_60 = 0;
    local_78 = 0x3d4ccccd;
    uStack_70 = 0;
    local_c0 = 0;
    iVar4 = 0;
    local_50 = g;
    do {
      ordenaPopulacaoAtual(this,g);
      ppRVar1 = (this->popAtual).
                super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->popAtual).
                        super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppRVar1 >> 3) <=
          (long)this->tamPop - 1U) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      local_38 = ppRVar1[(long)this->tamPop + -1]->active_loss * 100000.0;
      local_c0 = local_c0 + 1;
      if (local_38 < local_a0) {
        local_c0 = 0;
        iVar4 = local_bc;
      }
      if (local_c0 == local_88) {
        fVar17 = (float)(~-(uint)((float)local_78 < local_98) & (uint)(float)local_78 |
                        (uint)((float)local_78 * local_90) & -(uint)((float)local_78 < local_98));
        fVar18 = (float)(~-(uint)((float)local_68 < local_94) & (uint)(float)local_68 |
                        (uint)((float)local_68 * local_8c) & -(uint)((float)local_68 < local_94));
        local_68 = CONCAT44(local_68._4_4_,fVar18);
        local_78 = CONCAT44(local_78._4_4_,fVar17);
        if ((fVar18 < local_94) || (fVar17 < local_98)) {
          if (iStack_b0._M_current == local_a8) {
            local_c0 = 0;
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_b8,iStack_b0,&local_bc);
          }
          else {
            local_c0 = 0;
            *iStack_b0._M_current = local_bc;
            iStack_b0._M_current = iStack_b0._M_current + 1;
          }
        }
        else {
          local_c0 = 0;
        }
      }
      std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::operator=(local_48,local_40);
      dVar3 = (double)this->tamPop;
      uVar5 = (uint)(dVar3 * 0.05);
      local_80 = (ulong)uVar5;
      iVar8 = (int)(dVar3 * 0.1);
      local_84 = iVar4;
      if ((int)uVar5 < this->tamPop - iVar8) {
        uVar14 = (ulong)(int)uVar5;
        do {
          rand();
          iVar4 = rand();
          uVar13 = iVar4 % this->tamPop;
          iVar4 = rand();
          uVar6 = iVar4 % this->tamPop;
          iVar4 = rand();
          uVar9 = (long)iVar4 % (long)this->tamPop;
          uVar11 = uVar9 & 0xffffffff;
          uVar10 = (ulong)(int)uVar13;
          ppRVar1 = (this->popAnterior).
                    super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar7 = (long)(this->popAnterior).
                        super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppRVar1 >> 3;
          uVar12 = uVar10;
          if ((uVar7 <= uVar10) || (uVar12 = (ulong)(int)uVar6, uVar7 <= uVar12)) {
LAB_00108519:
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar12);
          }
          if (ppRVar1[uVar10]->active_loss <= ppRVar1[uVar12]->active_loss &&
              ppRVar1[uVar12]->active_loss != ppRVar1[uVar10]->active_loss) {
            uVar6 = uVar13;
          }
          uVar10 = (ulong)(int)uVar6;
          uVar12 = uVar10;
          if ((uVar7 <= uVar10) || (uVar12 = (ulong)(int)uVar9, uVar7 <= uVar12)) goto LAB_00108519;
          if (ppRVar1[uVar10]->active_loss <= ppRVar1[uVar12]->active_loss &&
              ppRVar1[uVar12]->active_loss != ppRVar1[uVar10]->active_loss) {
            uVar11 = (ulong)uVar6;
          }
          do {
            iVar4 = rand();
            iVar4 = iVar4 % this->tamPop;
          } while (iVar4 == (int)uVar11);
          uVar11 = (ulong)(int)uVar11;
          ppRVar1 = (this->popAnterior).
                    super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar12 = (long)(this->popAnterior).
                         super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)ppRVar1 >> 3;
          uVar9 = uVar11;
          if (((uVar12 <= uVar11) || (uVar7 = (ulong)iVar4, uVar9 = uVar7, uVar12 <= uVar7)) ||
             (this_00 = (Random_keys *)
                        (this->popAtual).
                        super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>.
                        _M_impl.super__Vector_impl_data._M_start, uVar9 = uVar14,
             (ulong)((long)(this->popAtual).
                           super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>.
                           _M_impl.super__Vector_impl_data._M_finish - (long)this_00 >> 3) <= uVar14
             )) {
LAB_00108503:
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar9);
          }
          cruzamento2(this_00,ppRVar1[uVar11],ppRVar1[uVar7],
                      *(RK_Individual **)(&this_00->numGeracoes + uVar14 * 2));
          ppRVar1 = (this->popAtual).
                    super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar12 = (long)(this->popAtual).
                         super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)ppRVar1 >> 3;
          if ((long)(int)(uVar5 * 5) < (long)uVar14) {
            if (uVar12 <= uVar14) goto LAB_00108503;
            mutacao(this_00,ppRVar1[uVar14]);
          }
          else {
            if (uVar12 <= uVar14) goto LAB_00108503;
            mutacaoAdaptavitva(this_00,ppRVar1[uVar14],(float)local_78,(float)local_68);
          }
          uVar14 = uVar14 + 1;
        } while ((long)uVar14 < (long)this->tamPop - (long)iVar8);
      }
      g = local_50;
      if (0 < (int)local_80) {
        uVar14 = local_80 & 0xffffffff;
        uVar9 = 0;
        do {
          ppRVar1 = (this->popAtual).
                    super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if ((ulong)((long)(this->popAtual).
                            super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppRVar1 >> 3) <= uVar9
             ) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar9);
          }
          RK_Individual::generate_random_weights(ppRVar1[uVar9]);
          uVar9 = uVar9 + 1;
        } while (uVar14 != uVar9);
      }
      uVar15 = SUB84(local_38,0);
      uVar16 = (undefined4)((ulong)local_38 >> 0x20);
      if (local_a0 <= local_38) {
        uVar15 = SUB84(local_a0,0);
        uVar16 = (undefined4)((ulong)local_a0 >> 0x20);
      }
      local_bc = local_bc + 1;
      local_a0 = (double)CONCAT44(uVar16,uVar15);
      iVar4 = local_84;
    } while (local_bc < this->numGeracoes);
  }
  ordenaPopulacaoAtual(this,g);
  if (iStack_b0._M_current != local_b8) {
    uVar14 = 0;
    do {
      printf("%d,",(ulong)(uint)local_b8[uVar14]);
      uVar14 = uVar14 + 1;
    } while (uVar14 < (ulong)((long)iStack_b0._M_current - (long)local_b8 >> 2));
  }
  if (local_b8 != (int *)0x0) {
    operator_delete(local_b8,(long)local_a8 - (long)local_b8);
  }
  return iVar4;
}

Assistant:

int
Random_keys::avancaGeracaoesAdaptativo2(Graph *g, int it_s_melhora, float maxMutacao, float max_pct, float taxaTamMut,
                                        float taxaPctMut) {

    int it=0;
    vector<int> chamadaGeracao;

    ///parametros da mutacao adaptativa
    float tamMutacao = 0.05;
    float pctMutacao = 0.1;
    ///--------------------------------

    int melhorGeracao = 0;
    RK_Individual *best = popAtual.at(this->tamPop - 1);
    this->ordenaPopulacaoAtual(g);
    double perda = 100*1000*best->getActiveLoss();
    for(int k=0; k<this->numGeracoes; k++){

        /** calcula a funcao criterio para cada individuo
         e ordena a populacao da maior perda(pior individuo)
         pra menor perda(melhor individuo), perdaAtiva**/
        this->ordenaPopulacaoAtual(g);

        RK_Individual *best = popAtual.at(this->tamPop - 1);
        if (100*1000*best->getActiveLoss() < perda){
            perda = 100*1000*best->getActiveLoss();
//            printf("\ngeracao (%d)  melhor individuo: %lf kw", k, 100*1000*best->getPerdaAtiva());//resultado ja em kw
            melhorGeracao = k;
            it=0;
        }else{
            it++;
        }

        if(it==it_s_melhora){
            if(tamMutacao<maxMutacao)
                tamMutacao*=taxaTamMut;
            if(pctMutacao<max_pct)
                pctMutacao*=taxaPctMut;
            if(pctMutacao<max_pct || tamMutacao<maxMutacao){
                chamadaGeracao.push_back(k);
//                printf("(%f, %f)", tamMutacao, pctMutacao);
            }
            it=0;
        }

        popAnterior = popAtual;

        int num_piores = 0.05*this->tamPop;
        int num_melhores = 0.1*this->tamPop;

        for(int i=num_piores; i<this->tamPop-num_melhores; i++){

            /** cruzamento entre pai1 e pai2 entre os
            individuos aleatorios da populacao anterior
            modificar por uma escolha em roleta no futuro**/
            int pai1 = rand() % this->tamPop;
//            int pai2 = rand() % this->tamPop; //aleatorio

            /*torneio com 3*/
            int cand1, cand2, cand3;
            cand1 = rand() % this->tamPop;
            cand2 = rand() % this->tamPop;
            cand3 = rand() % this->tamPop;

            int aux = cand1;

            if(popAnterior.at(cand1)->getActiveLoss() < popAnterior.at(cand2)->getActiveLoss()){
                cand2=cand1;
            }else{aux = cand2;}
            if(popAnterior.at(cand2)->getActiveLoss() < popAnterior.at(cand3)->getActiveLoss()){
                cand3=cand2;
            }else{aux = cand3;}
            pai1 = aux;

            int pai2 = cand3;

            while(pai2==pai1)
                pai2 = rand() % this->tamPop;

//            popAnterior.at(pai1)->cruzamentoMedia2(popAnterior.at(pai2), popAtual.at(i));
            this->cruzamento2(popAnterior.at(pai1), popAnterior.at(pai2), popAtual.at(i));
//            popAtual.at(i)->mutacao();

            if(i<=5*num_piores)
                this->mutacaoAdaptavitva(popAtual.at(i), tamMutacao, pctMutacao);
            else
                this->mutacao(popAtual.at(i));
        }

        /**aleatorio ao inves de manter piores**/
        for(int i=0; i<num_piores; i++)
            popAtual.at(i)->generate_random_weights();
    }

//    cout << "\n--------------------------------------"<<endl;
//    for(unsigned int i=0; i<popAtual.size(); i++)
//        cout << 100*1000*popAtual.at(i)->getPerdaAtiva() << " , ";
//    cout << "\n--------------------------------------"<<endl;

    this->ordenaPopulacaoAtual(g);

    for(unsigned long int i=0; i<chamadaGeracao.size();i++)
        printf("%d,", chamadaGeracao.at(i));

    return melhorGeracao;
}